

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,LabelName *name)

{
  string local_30;
  
  GetLocalName(&local_30,this,(name->super_LocalName).name,true);
  WriteData(this,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void CWriter::Write(const LabelName& name) {
  Write(GetLocalName(name.name, true));
}